

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O3

String * __thiscall
CommandLineOption::describe(String *__return_storage_ptr__,CommandLineOption *this)

{
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  char local_2f;
  undefined2 local_2e;
  
  if (*(this->_longform)._string._M_dataplus._M_p == '\0') {
    local_2f = this->_shortform;
    local_30 = 0x2d;
    local_2e = 0;
    local_38 = 3;
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,&local_30,(long)&local_2e + 1);
    if (local_40 == &local_30) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--","");
    String::operator+(__return_storage_ptr__,(String *)&local_40,&this->_longform);
    if (local_40 == &local_30) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40);
  return __return_storage_ptr__;
}

Assistant:

inline String describe() const
	{
		return std::strlen (_longform)
			? (String ("--") + _longform)
			: String ({'-', _shortform, '\0'});
	}